

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

AffineSpace3fa * __thiscall
embree::XMLLoader::load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
          (AffineSpace3fa *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  Token *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [8];
  _Alloc_hider _Var7;
  int iVar8;
  runtime_error *this_01;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 extraout_XMM0_Dd;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float fVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  float fVar23;
  float fVar24;
  float fVar29;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  float fVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  Vec3f v;
  Vec3f p;
  string local_218;
  undefined1 local_1f8 [8];
  float local_1f0;
  char local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  float local_188;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  string local_168;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  string local_138;
  float local_118;
  float local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar26 [16];
  
  pXVar1 = xml->ptr;
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"translate","");
  XML::parm(&local_218,pXVar1,(string *)local_1f8);
  iVar8 = std::__cxx11::string::compare((char *)&local_218);
  paVar11 = &local_218.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar11) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8);
  }
  if (iVar8 != 0) {
    pXVar1 = xml->ptr;
    local_218._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"translate","");
    XML::parm(&local_70,pXVar1,&local_218);
    string_to_Vec3f((embree *)local_1f8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar11) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    aVar19.m128[2] = local_1f0;
    aVar19._0_8_ = local_1f8;
    aVar19.m128[3] = 0.0;
    aVar15._0_12_ = ZEXT812(0x3f800000);
    aVar15.m128[3] = 0.0;
    (__return_storage_ptr__->l).vx.field_0 = aVar15;
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = 0x3f80000000000000;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = 0x3f800000;
    (__return_storage_ptr__->p).field_0 = aVar19;
    return __return_storage_ptr__;
  }
  pXVar1 = xml->ptr;
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"scale","");
  XML::parm(&local_218,pXVar1,(string *)local_1f8);
  iVar8 = std::__cxx11::string::compare((char *)&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar11) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8);
  }
  if (iVar8 != 0) {
    pXVar1 = xml->ptr;
    local_218._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"scale","");
    XML::parm(&local_90,pXVar1,&local_218);
    string_to_Vec3f((embree *)local_1f8,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    auVar6 = local_1f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar11) {
      operator_delete(local_218._M_dataplus._M_p);
      auVar6 = local_1f8;
    }
    local_1f8._4_4_ = (undefined4)((ulong)auVar6 >> 0x20);
    local_1f8._0_4_ = SUB84(auVar6,0);
    aVar31._0_12_ = ZEXT812(0);
    aVar31.m128[3] = 0.0;
    (__return_storage_ptr__->l).vx.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT416((uint)local_1f8._0_4_);
    (__return_storage_ptr__->l).vy.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)local_1f8._4_4_) << 0x20);
    (__return_storage_ptr__->l).vz.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)local_1f0) << 0x40);
    (__return_storage_ptr__->p).field_0 = aVar31;
    return __return_storage_ptr__;
  }
  pXVar1 = xml->ptr;
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate_x","");
  XML::parm(&local_218,pXVar1,(string *)local_1f8);
  iVar8 = std::__cxx11::string::compare((char *)&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar11) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8);
  }
  if (iVar8 == 0) {
LAB_0017694e:
    pXVar1 = xml->ptr;
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate_y","");
    XML::parm(&local_218,pXVar1,(string *)local_1f8);
    iVar8 = std::__cxx11::string::compare((char *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar11) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8);
    }
    if (iVar8 == 0) {
      pXVar1 = xml->ptr;
      local_1f8 = (undefined1  [8])local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate_z","");
      XML::parm(&local_218,pXVar1,(string *)local_1f8);
      iVar8 = std::__cxx11::string::compare((char *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar11) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if (local_1f8 != (undefined1  [8])local_1e8) {
        operator_delete((void *)local_1f8);
      }
      if (iVar8 == 0) {
        pXVar1 = xml->ptr;
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"angle","");
        XML::parm(&local_218,pXVar1,(string *)local_1f8);
        iVar8 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar8 == 0) {
          bVar12 = false;
        }
        else {
          pXVar1 = xml->ptr;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"axis","");
          XML::parm((string *)&local_1a8,pXVar1,&local_168);
          iVar8 = std::__cxx11::string::compare(local_1a8._M_local_buf);
          if (iVar8 == 0) {
            bVar12 = false;
          }
          else {
            pXVar1 = xml->ptr;
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"point","");
            XML::parm(&local_50,pXVar1,&local_138);
            iVar8 = std::__cxx11::string::compare((char *)&local_50);
            bVar12 = iVar8 != 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            paVar11 = &local_218.field_2;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                          local_1a8._M_allocated_capacity._0_4_) != &local_198) {
            operator_delete((undefined1 *)
                            CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                                     local_1a8._M_allocated_capacity._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar11) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8);
        }
        if (bVar12) {
          pXVar1 = xml->ptr;
          local_1f8 = (undefined1  [8])local_1e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"angle","");
          XML::parm(&local_218,pXVar1,(string *)local_1f8);
          fVar13 = std::__cxx11::stof(&local_218,(size_t *)0x0);
          local_1d8._0_4_ = fVar13;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar11) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          if (local_1f8 != (undefined1  [8])local_1e8) {
            operator_delete((void *)local_1f8);
          }
          pXVar1 = xml->ptr;
          local_218._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"axis","");
          XML::parm(&local_b0,pXVar1,&local_218);
          string_to_Vec3f((embree *)local_1f8,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar11) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          pXVar1 = xml->ptr;
          local_218._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"point","");
          XML::parm(&local_d0,pXVar1,&local_218);
          string_to_Vec3f((embree *)local_1a8._M_local_buf,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          auVar6 = local_1f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar11) {
            operator_delete(local_218._M_dataplus._M_p);
            auVar6 = local_1f8;
          }
          local_1f8._4_4_ = (undefined4)((ulong)auVar6 >> 0x20);
          local_1f8._0_4_ = SUB84(auVar6,0);
          local_1c8._4_4_ = local_1a8._8_4_;
          local_1c8._0_4_ = local_1a8._M_allocated_capacity._4_4_;
          uStack_1c0 = 0;
          local_1b8 = ZEXT416((uint)local_1a8._M_allocated_capacity._0_4_);
          local_178._4_4_ = local_1a8._M_allocated_capacity._4_4_;
          local_178._0_4_ = local_1a8._M_allocated_capacity._0_4_;
          fStack_170 = (float)local_1a8._8_4_;
          fStack_16c = 0.0;
          fVar13 = (float)local_1d8._0_4_ * 0.017453292;
          local_1d8._0_4_ = fVar13;
          fVar14 = (float)local_1f8._4_4_ * (float)local_1f8._4_4_;
          fVar22 = local_1f0 * local_1f0;
          fVar23 = fVar14 + (float)local_1f8._0_4_ * (float)local_1f8._0_4_ + fVar22;
          auVar26._0_8_ = CONCAT44(fVar14 + fVar14 + 0.0,fVar23);
          auVar26._8_4_ = fVar14 + fVar22 + fVar22;
          auVar26._12_4_ = fVar14 + 0.0 + 0.0;
          auVar32._8_4_ = auVar26._8_4_;
          auVar32._0_8_ = auVar26._0_8_;
          auVar32._12_4_ = auVar26._12_4_;
          auVar17 = rsqrtss(auVar32,auVar26);
          fVar14 = auVar17._0_4_;
          fStack_13c = fVar14 * fVar14 * fVar23 * -0.5 * fVar14 + fVar14 * 1.5;
          local_148 = fStack_13c * (float)local_1f8._0_4_;
          fStack_144 = fStack_13c * (float)local_1f8._4_4_;
          fStack_140 = fStack_13c * local_1f0;
          fStack_13c = fStack_13c * 0.0;
          local_1f8 = auVar6;
          local_188 = sinf(fVar13);
          fVar13 = cosf((float)local_1d8._0_4_);
          fVar14 = (1.0 - local_148 * local_148) * fVar13 + local_148 * local_148;
          fVar34 = 1.0 - fVar13;
          fVar37 = local_148 * fStack_144 * fVar34;
          fVar24 = fVar37 - local_188 * fStack_140;
          fVar37 = local_188 * fStack_140 + fVar37;
          fVar38 = (1.0 - fStack_144 * fStack_144) * fVar13 + fStack_144 * fStack_144;
          fVar40 = local_148 * fStack_140 * fVar34;
          fVar34 = fStack_144 * fStack_140 * fVar34;
          fVar35 = fVar40 + local_188 * fStack_144;
          fVar40 = fVar40 - local_188 * fStack_144;
          fVar39 = fVar34 - local_148 * local_188;
          fVar34 = local_148 * local_188 + fVar34;
          fVar30 = (1.0 - fStack_140 * fStack_140) * fVar13 + fStack_140 * fStack_140;
          fVar13 = fVar14 * 1.0 + fVar37 * 0.0 + fVar40 * 0.0;
          fVar22 = fVar14 * 0.0 + fVar37 * 1.0 + fVar40 * 0.0;
          fVar23 = fVar14 * 0.0 + fVar37 * 0.0 + fVar40 * 1.0;
          fVar14 = fVar14 * 0.0 + fVar37 * 0.0 + fVar40 * 0.0;
          fVar37 = fVar24 * 1.0 + fVar38 * 0.0 + fVar34 * 0.0;
          fVar40 = fVar24 * 0.0 + fVar38 * 1.0 + fVar34 * 0.0;
          fVar29 = fVar24 * 0.0 + fVar38 * 0.0 + fVar34 * 1.0;
          fVar24 = fVar24 * 0.0 + fVar38 * 0.0 + fVar34 * 0.0;
          fVar34 = fVar35 * 1.0 + fVar39 * 0.0 + fVar30 * 0.0;
          fVar38 = fVar35 * 0.0 + fVar39 * 1.0 + fVar30 * 0.0;
          fVar36 = fVar35 * 0.0 + fVar39 * 0.0 + fVar30 * 1.0;
          fVar30 = fVar35 * 0.0 + fVar39 * 0.0 + fVar30 * 0.0;
          (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar37 * 0.0 + fVar34 * 0.0 + fVar13;
          (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar40 * 0.0 + fVar38 * 0.0 + fVar22;
          (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar29 * 0.0 + fVar36 * 0.0 + fVar23;
          (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar24 * 0.0 + fVar30 * 0.0 + fVar14;
          (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar34 * 0.0 + fVar37 + fVar13 * 0.0;
          (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar38 * 0.0 + fVar40 + fVar22 * 0.0;
          (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar36 * 0.0 + fVar29 + fVar23 * 0.0;
          (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar30 * 0.0 + fVar24 + fVar14 * 0.0;
          (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar13 * 0.0 + fVar34 + fVar37 * 0.0;
          (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar22 * 0.0 + fVar38 + fVar40 * 0.0;
          (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar23 * 0.0 + fVar36 + fVar29 * 0.0;
          (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar14 * 0.0 + fVar30 + fVar24 * 0.0;
          (__return_storage_ptr__->p).field_0.m128[0] =
               ((-(float)local_1c8._0_4_ * fVar37 - (float)local_1c8._4_4_ * fVar34) -
               (float)local_1b8._0_4_ * fVar13) + (float)local_178._0_4_ + 0.0;
          (__return_storage_ptr__->p).field_0.m128[1] =
               ((-(float)local_1c8._0_4_ * fVar40 - (float)local_1c8._4_4_ * fVar38) -
               (float)local_1b8._0_4_ * fVar22) + (float)local_178._4_4_ + 0.0;
          (__return_storage_ptr__->p).field_0.m128[2] =
               ((-(float)local_1c8._0_4_ * fVar29 - (float)local_1c8._4_4_ * fVar36) -
               (float)local_1b8._0_4_ * fVar23) + fStack_170 + 0.0;
          (__return_storage_ptr__->p).field_0.m128[3] =
               ((-(float)local_1c8._0_4_ * fVar24 - (float)local_1c8._4_4_ * fVar30) -
               (float)local_1b8._0_4_ * fVar14) + fStack_16c + 0.0;
          return __return_storage_ptr__;
        }
        pXVar1 = xml->ptr;
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"angle","");
        XML::parm(&local_218,pXVar1,(string *)local_1f8);
        iVar8 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar8 == 0) {
          bVar12 = false;
        }
        else {
          pXVar1 = xml->ptr;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"axis","");
          XML::parm((string *)&local_1a8,pXVar1,&local_168);
          iVar8 = std::__cxx11::string::compare(local_1a8._M_local_buf);
          bVar12 = iVar8 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                          local_1a8._M_allocated_capacity._0_4_) != &local_198) {
            operator_delete((undefined1 *)
                            CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                                     local_1a8._M_allocated_capacity._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
        }
        paVar11 = &local_218.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar11) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8);
        }
        if (!bVar12) {
          this_00 = (xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)this_00 == 0x360) {
            local_1d8._0_4_ = Token::Float(this_00,true);
            local_1d8._4_4_ = extraout_XMM0_Db_01;
            local_1d8._8_4_ = extraout_XMM0_Dc_01;
            local_1d8._12_4_ = extraout_XMM0_Dd_01;
            local_1b8._0_4_ =
                 Token::Float((xml->ptr->body).
                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1,true);
            local_1b8._4_4_ = extraout_XMM0_Db_02;
            local_1b8._8_4_ = extraout_XMM0_Dc_02;
            local_1b8._12_4_ = extraout_XMM0_Dd_02;
            local_1c8._0_4_ =
                 Token::Float((xml->ptr->body).
                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start + 2,true);
            local_1c8._4_4_ = extraout_XMM0_Db_03;
            uStack_1c0._0_4_ = (float)extraout_XMM0_Dc_03;
            uStack_1c0._4_4_ = extraout_XMM0_Dd_03;
            local_178._0_4_ =
                 Token::Float((xml->ptr->body).
                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4,true);
            local_178._4_4_ = extraout_XMM0_Db_04;
            fStack_170 = (float)extraout_XMM0_Dc_04;
            fStack_16c = (float)extraout_XMM0_Dd_04;
            local_188 = Token::Float((xml->ptr->body).
                                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 5,true);
            local_148 = Token::Float((xml->ptr->body).
                                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 6,true);
            local_108 = Token::Float((xml->ptr->body).
                                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 8,true);
            local_118 = Token::Float((xml->ptr->body).
                                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 9,true);
            fVar13 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 10,true);
            local_1d8._4_4_ = local_178._0_4_;
            local_1d8._8_4_ = local_108;
            local_1d8._12_4_ = 0;
            local_1b8._4_4_ = local_188;
            local_1b8._8_4_ = local_118;
            local_1b8._12_4_ = 0;
            local_1c8._4_4_ = local_148;
            uStack_1c0._0_4_ = fVar13;
            uStack_1c0._4_4_ = 0;
            local_178._0_4_ =
                 Token::Float((xml->ptr->body).
                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start + 3,true);
            local_178._4_4_ = extraout_XMM0_Db_05;
            fStack_170 = (float)extraout_XMM0_Dc_05;
            fStack_16c = (float)extraout_XMM0_Dd_05;
            local_188 = Token::Float((xml->ptr->body).
                                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 7,true);
            fVar13 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 0xb,true);
            aVar28.m128[1] = local_188;
            aVar28.m128[0] = (float)local_178._0_4_;
            aVar28.m128[2] = fVar13;
            aVar28.m128[3] = 0.0;
            *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = local_1d8._0_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = local_1d8._8_8_;
            *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = local_1b8._0_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = local_1b8._8_8_;
            *(undefined1 (*) [8])&(__return_storage_ptr__->l).vz.field_0 = local_1c8;
            *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_1c0;
            (__return_storage_ptr__->p).field_0 = aVar28;
            return __return_storage_ptr__;
          }
          goto LAB_00177908;
        }
        pXVar1 = xml->ptr;
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"angle","");
        XML::parm(&local_218,pXVar1,(string *)local_1f8);
        fVar13 = std::__cxx11::stof(&local_218,(size_t *)0x0);
        local_1d8._0_4_ = fVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar11) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8);
        }
        pXVar1 = xml->ptr;
        local_218._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"axis","");
        XML::parm(&local_f0,pXVar1,&local_218);
        string_to_Vec3f((embree *)local_1f8,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        auVar6 = local_1f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar11) {
          operator_delete(local_218._M_dataplus._M_p);
          auVar6 = local_1f8;
        }
        local_1f8._4_4_ = (undefined4)((ulong)auVar6 >> 0x20);
        local_1f8._0_4_ = SUB84(auVar6,0);
        fVar13 = (float)local_1d8._0_4_ * 0.017453292;
        local_1d8._0_4_ = fVar13;
        fVar14 = (float)local_1f8._4_4_ * (float)local_1f8._4_4_;
        fVar22 = local_1f0 * local_1f0;
        fVar23 = fVar14 + (float)local_1f8._0_4_ * (float)local_1f8._0_4_ + fVar22;
        auVar27._0_8_ = CONCAT44(fVar14 + fVar14 + 0.0,fVar23);
        auVar27._8_4_ = fVar14 + fVar22 + fVar22;
        auVar27._12_4_ = fVar14 + 0.0 + 0.0;
        auVar33._8_4_ = auVar27._8_4_;
        auVar33._0_8_ = auVar27._0_8_;
        auVar33._12_4_ = auVar27._12_4_;
        auVar17 = rsqrtss(auVar33,auVar27);
        fVar14 = auVar17._0_4_;
        fVar14 = fVar14 * fVar14 * fVar23 * -0.5 * fVar14 + fVar14 * 1.5;
        local_1c8._4_4_ = fVar14 * (float)local_1f8._4_4_;
        local_1c8._0_4_ = fVar14 * (float)local_1f8._0_4_;
        uStack_1c0._0_4_ = fVar14 * local_1f0;
        uStack_1c0._4_4_ = fVar14 * 0.0;
        local_1f8 = auVar6;
        local_1b8._0_4_ = sinf(fVar13);
        local_1b8._4_4_ = extraout_XMM0_Db_00;
        local_1b8._8_4_ = extraout_XMM0_Dc_00;
        local_1b8._12_4_ = extraout_XMM0_Dd_00;
        fVar13 = cosf((float)local_1d8._0_4_);
        aVar21._0_4_ = (1.0 - (float)local_1c8._0_4_ * (float)local_1c8._0_4_) * fVar13 +
                       (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
        fVar14 = 1.0 - fVar13;
        aVar21.m128[1] =
             (float)local_1c8._0_4_ * (float)local_1c8._4_4_ * fVar14 +
             (float)local_1b8._0_4_ * (float)uStack_1c0;
        aVar21.m128[2] =
             (float)uStack_1c0 * (float)local_1c8._0_4_ * fVar14 -
             (float)local_1c8._4_4_ * (float)local_1b8._0_4_;
        aVar21.m128[3] = 0.0;
        (__return_storage_ptr__->l).vx.field_0 = aVar21;
        aVar3.m128[1] =
             (float)local_1c8._4_4_ * (float)local_1c8._4_4_ +
             fVar13 * (1.0 - (float)local_1c8._4_4_ * (float)local_1c8._4_4_);
        aVar3.m128[0] =
             fVar14 * (float)local_1c8._0_4_ * (float)local_1c8._4_4_ +
             (float)local_1b8._0_4_ * -(float)uStack_1c0;
        aVar3.m128[2] =
             (float)uStack_1c0 * (float)local_1c8._4_4_ * fVar14 +
             (float)local_1c8._0_4_ * (float)local_1b8._0_4_;
        aVar3.m128[3] = 0.0;
        (__return_storage_ptr__->l).vy.field_0 = aVar3;
        aVar5.m128[1] =
             fVar14 * (float)uStack_1c0 * (float)local_1c8._4_4_ +
             -(float)local_1c8._0_4_ * (float)local_1b8._0_4_;
        aVar5.m128[0] =
             fVar14 * (float)uStack_1c0 * (float)local_1c8._0_4_ +
             (float)local_1c8._4_4_ * (float)local_1b8._0_4_;
        aVar5.m128[2] =
             (1.0 - (float)uStack_1c0 * (float)uStack_1c0) * fVar13 +
             (float)uStack_1c0 * (float)uStack_1c0;
        aVar5.m128[3] = 0.0;
        (__return_storage_ptr__->l).vz.field_0 = aVar5;
        goto code_r0x00176ee8;
      }
      pXVar1 = xml->ptr;
      local_1f8 = (undefined1  [8])local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate_z","");
      XML::parm(&local_218,pXVar1,(string *)local_1f8);
      _Var7._M_p = local_218._M_dataplus._M_p;
      xml = (Ref<embree::XML> *)__errno_location();
      iVar8 = *(int *)&xml->ptr;
      *(int *)&xml->ptr = 0;
      fVar13 = strtof(_Var7._M_p,(char **)&local_1a8._M_allocated_capacity);
      local_1d8._0_4_ = fVar13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a8._M_allocated_capacity._4_4_,local_1a8._M_allocated_capacity._0_4_)
          != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var7._M_p) {
        paVar10 = &local_218.field_2;
        if (*(int *)&xml->ptr == 0) {
          *(int *)&xml->ptr = iVar8;
        }
        else if (*(int *)&xml->ptr == 0x22) {
          std::__throw_out_of_range("stof");
          goto LAB_00176ba8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar10) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8);
        }
        fVar13 = (float)local_1d8._0_4_ * 0.017453292;
        local_1d8._0_4_ = fVar13;
        auVar25._0_12_ = ZEXT812(0x3f800000);
        auVar25._12_4_ = 0;
        auVar17 = rsqrtss(auVar25,auVar25);
        fVar14 = auVar17._0_4_;
        fVar14 = fVar14 * fVar14 * fVar14 * -0.5 + fVar14 * 1.5;
        local_1c8._4_4_ = fVar14 * 0.0;
        uStack_1c0._0_4_ = fVar14 * 1.0;
        goto LAB_00176db9;
      }
LAB_001778fc:
      std::__throw_invalid_argument("stof");
LAB_00177908:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_((string *)local_1f8,&xml->ptr->loc);
      plVar9 = (long *)std::__cxx11::string::append(local_1f8);
      local_218._M_dataplus._M_p = (pointer)*plVar9;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == paVar11) {
        local_218.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_218.field_2._8_8_ = plVar9[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_218._M_string_length = plVar9[1];
      *plVar9 = (long)paVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::runtime_error::runtime_error(this_01,(string *)&local_218);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pXVar1 = xml->ptr;
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate_y","");
    XML::parm(&local_218,pXVar1,(string *)local_1f8);
    _Var7._M_p = local_218._M_dataplus._M_p;
    xml = (Ref<embree::XML> *)__errno_location();
    iVar8 = *(int *)&xml->ptr;
    *(int *)&xml->ptr = 0;
    fVar13 = strtof(_Var7._M_p,(char **)&local_1a8._M_allocated_capacity);
    local_1d8._0_4_ = fVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a8._M_allocated_capacity._4_4_,local_1a8._M_allocated_capacity._0_4_) ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p) goto LAB_001778f0;
    paVar10 = &local_218.field_2;
    if (*(int *)&xml->ptr == 0) {
LAB_00176ba8:
      *(int *)&xml->ptr = iVar8;
    }
    else if (*(int *)&xml->ptr == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00176a3b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar10) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8);
    }
    fVar13 = (float)local_1d8._0_4_ * 0.017453292;
    local_1d8._0_4_ = fVar13;
    auVar17._0_12_ = ZEXT812(0x3f800000);
    auVar17._12_4_ = 0;
    auVar17 = rsqrtss(auVar17,auVar17);
    fVar14 = auVar17._0_4_;
    fVar14 = fVar14 * fVar14 * fVar14 * -0.5 + fVar14 * 1.5;
    local_1c8._4_4_ = fVar14 * 1.0;
    uStack_1c0._0_4_ = fVar14 * 0.0;
LAB_00176db9:
    local_1c8._0_4_ = fVar14 * 0.0;
    uStack_1c0._4_4_ = fVar14 * 0.0;
  }
  else {
    pXVar1 = xml->ptr;
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate_x","");
    XML::parm(&local_218,pXVar1,(string *)local_1f8);
    _Var7._M_p = local_218._M_dataplus._M_p;
    xml = (Ref<embree::XML> *)__errno_location();
    iVar8 = *(int *)&xml->ptr;
    *(int *)&xml->ptr = 0;
    paVar11 = &local_1a8;
    local_1d8._0_4_ = strtof(_Var7._M_p,(char **)&paVar11->_M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a8._M_allocated_capacity._4_4_,local_1a8._M_allocated_capacity._0_4_) ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p) {
      std::__throw_invalid_argument("stof");
LAB_001778f0:
      std::__throw_invalid_argument("stof");
      goto LAB_001778fc;
    }
    paVar10 = &local_218.field_2;
    if (*(int *)&xml->ptr == 0) {
LAB_00176a3b:
      *(int *)&xml->ptr = iVar8;
    }
    else if (*(int *)&xml->ptr == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_0017694e;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar10) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8);
    }
    fVar13 = (float)local_1d8._0_4_ * 0.017453292;
    local_1d8._0_4_ = fVar13;
    auVar16._0_12_ = ZEXT812(0x3f800000);
    auVar16._12_4_ = 0;
    auVar17 = rsqrtss(auVar16,auVar16);
    fVar14 = auVar17._0_4_;
    fVar14 = fVar14 * fVar14 * fVar14 * -0.5 + fVar14 * 1.5;
    local_1c8._4_4_ = fVar14 * 0.0;
    local_1c8._0_4_ = fVar14 * 1.0;
    uStack_1c0._0_4_ = fVar14 * 0.0;
    uStack_1c0._4_4_ = fVar14 * 0.0;
  }
  local_1b8._0_4_ = sinf(fVar13);
  local_1b8._4_4_ = extraout_XMM0_Db;
  local_1b8._8_4_ = extraout_XMM0_Dc;
  local_1b8._12_4_ = extraout_XMM0_Dd;
  fVar13 = cosf((float)local_1d8._0_4_);
  aVar20._0_4_ = (1.0 - (float)local_1c8._0_4_ * (float)local_1c8._0_4_) * fVar13 +
                 (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
  fVar14 = 1.0 - fVar13;
  aVar20.m128[1] =
       (float)local_1c8._0_4_ * (float)local_1c8._4_4_ * fVar14 +
       (float)local_1b8._0_4_ * (float)uStack_1c0;
  aVar20.m128[2] =
       (float)uStack_1c0 * (float)local_1c8._0_4_ * fVar14 -
       (float)local_1c8._4_4_ * (float)local_1b8._0_4_;
  aVar20.m128[3] = 0.0;
  (__return_storage_ptr__->l).vx.field_0 = aVar20;
  aVar2.m128[1] =
       (float)local_1c8._4_4_ * (float)local_1c8._4_4_ +
       fVar13 * (1.0 - (float)local_1c8._4_4_ * (float)local_1c8._4_4_);
  aVar2.m128[0] =
       fVar14 * (float)local_1c8._0_4_ * (float)local_1c8._4_4_ +
       (float)local_1b8._0_4_ * -(float)uStack_1c0;
  aVar2.m128[2] =
       (float)uStack_1c0 * (float)local_1c8._4_4_ * fVar14 +
       (float)local_1c8._0_4_ * (float)local_1b8._0_4_;
  aVar2.m128[3] = 0.0;
  (__return_storage_ptr__->l).vy.field_0 = aVar2;
  aVar4.m128[1] =
       fVar14 * (float)uStack_1c0 * (float)local_1c8._4_4_ +
       -(float)local_1c8._0_4_ * (float)local_1b8._0_4_;
  aVar4.m128[0] =
       fVar14 * (float)uStack_1c0 * (float)local_1c8._0_4_ +
       (float)local_1c8._4_4_ * (float)local_1b8._0_4_;
  aVar4.m128[2] =
       (1.0 - (float)uStack_1c0 * (float)uStack_1c0) * fVar13 +
       (float)uStack_1c0 * (float)uStack_1c0;
  aVar4.m128[3] = 0.0;
  (__return_storage_ptr__->l).vz.field_0 = aVar4;
code_r0x00176ee8:
  aVar18._0_12_ = ZEXT812(0);
  aVar18.m128[3] = 0.0;
  (__return_storage_ptr__->p).field_0 = aVar18;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa XMLLoader::load<AffineSpace3fa>(const Ref<XML>& xml) 
  {
    if (xml->parm("translate") != "") {
      const Vec3f v = string_to_Vec3f(xml->parm("translate"));
      return AffineSpace3fa::translate(v);
    } else if (xml->parm("scale") != "") {
      const Vec3f v = string_to_Vec3f(xml->parm("scale"));
      return AffineSpace3fa::scale(v);
    } else if (xml->parm("rotate_x") != "") {
      const float degrees = std::stof(xml->parm("rotate_x"));
      return AffineSpace3fa::rotate(Vec3f(1,0,0),deg2rad(degrees));
    } else if (xml->parm("rotate_y") != "") {
      const float degrees = std::stof(xml->parm("rotate_y"));
      return AffineSpace3fa::rotate(Vec3f(0,1,0),deg2rad(degrees));
    } else if (xml->parm("rotate_z") != "") {
      const float degrees = std::stof(xml->parm("rotate_z"));
      return AffineSpace3fa::rotate(Vec3f(0,0,1),deg2rad(degrees));
    } else if (xml->parm("angle") != "" && xml->parm("axis") != "" && xml->parm("point") != "") {
      const float degrees = std::stof(xml->parm("angle"));
      const Vec3f v = string_to_Vec3f(xml->parm("axis"));
      const Vec3f p = string_to_Vec3f(xml->parm("point"));
      return AffineSpace3fa::rotate(p,v,deg2rad(degrees));
    } else if (xml->parm("angle") != "" && xml->parm("axis") != "") {
      const float degrees = std::stof(xml->parm("angle"));
      const Vec3f v = string_to_Vec3f(xml->parm("axis"));
      return AffineSpace3fa::rotate(v,deg2rad(degrees));
    } else {
      if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
      return AffineSpace3fa(LinearSpace3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[ 2].Float(),
                                           xml->body[4].Float(),xml->body[5].Float(),xml->body[ 6].Float(),
                                           xml->body[8].Float(),xml->body[9].Float(),xml->body[10].Float()),
                            Vec3fa(xml->body[3].Float(),xml->body[7].Float(),xml->body[11].Float()));
    }
  }